

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int *piVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 (*pauVar23) [16];
  undefined8 *puVar24;
  ulong uVar25;
  long lVar26;
  undefined1 (*pauVar27) [16];
  undefined8 *puVar28;
  int iVar29;
  long lVar30;
  int nn;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [64];
  size_t local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar15 = cpu_support_x86_avx2();
  if (iVar15 != 0) {
    im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar15 = cpu_support_x86_xop();
  if (iVar15 == 0) {
    uVar1 = bottom_im2col->w;
    uVar16 = (ulong)(int)uVar1;
    iVar15 = bottom_im2col->h;
    uVar22 = bottom_im2col->c;
    local_b0 = (ulong)(uint)top_blob->c;
    local_b8 = 0;
    local_f8._16_8_ = 0;
    local_f8._24_4_ = 0;
    local_f8._0_8_ = (void *)0x0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    local_f8._48_12_ = SUB1612((undefined1  [16])0x0,4);
    local_f8._32_8_ = (Allocator *)0x0;
    local_f8._40_4_ = 0;
    local_f8._44_4_ = 0;
    uVar21 = (uVar1 & 1) + (uVar1 >> 1);
    if ((long)uVar16 < 2) {
      uVar21 = uVar1;
    }
    Mat::create((Mat *)local_f8,iVar15 << (1 < (long)uVar16),uVar22,uVar21,8,8,
                opt->workspace_allocator);
    if (0 < (int)uVar1 >> 1) {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (0 < (int)uVar22) {
          pauVar23 = (undefined1 (*) [16])(local_b8 * uVar19 * local_f8._16_8_ + local_f8._0_8_);
          uVar25 = 0;
          do {
            if (0 < iVar15) {
              pauVar27 = (undefined1 (*) [16])
                         ((long)bottom_im2col->data +
                         bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar17);
              iVar29 = iVar15;
              do {
                *pauVar23 = *pauVar27;
                pauVar23 = pauVar23 + 1;
                pauVar27 = (undefined1 (*) [16])(*pauVar27 + (ulong)uVar1 * 8);
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar22);
        }
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x10;
      } while (uVar19 != (uint)((int)uVar1 >> 1));
    }
    uVar19 = uVar16 & 0xfffffffffffffffe;
    if ((uint)uVar19 != uVar1) {
      pvVar18 = (void *)(uVar19 * 8 + (long)bottom_im2col->data);
      do {
        if (0 < (int)uVar22) {
          uVar21 = ((uint)(uVar19 >> 0x1f) & 1) + (int)uVar19;
          puVar24 = (undefined8 *)
                    ((long)(int)(((int)uVar21 >> 1) + ((int)uVar19 - (uVar21 & 0xfffffffe))) *
                     local_b8 * local_f8._16_8_ + local_f8._0_8_);
          uVar25 = 0;
          do {
            if (0 < iVar15) {
              puVar28 = (undefined8 *)
                        (bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + (long)pvVar18);
              iVar29 = iVar15;
              do {
                *puVar24 = *puVar28;
                puVar24 = puVar24 + 1;
                puVar28 = puVar28 + uVar16;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar22);
        }
        uVar19 = uVar19 + 1;
        pvVar18 = (void *)((long)pvVar18 + 8);
      } while ((long)uVar19 < (long)uVar16);
    }
    if (0 < (int)local_b0) {
      iVar15 = iVar15 * uVar22;
      uVar19 = 0;
      do {
        pauVar23 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar19 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar1 < 2) {
          uVar25 = 0;
        }
        else {
          lVar17 = 0;
          uVar20 = 0;
          do {
            if (iVar15 < 1) {
              auVar37 = (undefined1  [16])0x0;
              local_108 = (undefined1  [16])0x0;
              local_138 = (undefined1  [16])0x0;
              auVar33 = (undefined1  [16])0x0;
              auVar36 = (undefined1  [16])0x0;
              local_118 = (undefined1  [16])0x0;
              local_128 = (undefined1  [16])0x0;
              auVar31 = (undefined1  [16])0x0;
            }
            else {
              lVar26 = kernel->cstep * uVar19 * kernel->elemsize;
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              lVar30 = 0;
              local_128 = (undefined1  [16])0x0;
              local_118 = (undefined1  [16])0x0;
              local_138 = (undefined1  [16])0x0;
              local_108 = (undefined1  [16])0x0;
              iVar29 = iVar15;
              auVar36 = ZEXT816(0) << 0x40;
              auVar37 = ZEXT816(0) << 0x40;
              auVar33 = ZEXT816(0) << 0x40;
              do {
                local_48 = auVar33;
                local_98 = auVar37;
                local_a8 = auVar36;
                auVar31 = *(undefined1 (*) [16])
                           (local_f8._0_8_ + lVar30 + local_b8 * local_f8._16_8_ * lVar17);
                auVar36 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
                auVar12 = vpunpcklbw_avx(auVar31,auVar36);
                auVar11 = vpunpckhbw_avx(auVar31,auVar36);
                auVar31 = *(undefined1 (*) [16])((long)kernel->data + lVar30 * 2 + lVar26);
                auVar36 = *(undefined1 (*) [16])((long)kernel->data + lVar30 * 2 + lVar26 + 0x10);
                auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
                auVar37 = vpcmpgtb_avx((undefined1  [16])0x0,auVar36);
                auVar13 = vpunpcklbw_avx(auVar31,auVar33);
                auVar31 = vpunpckhbw_avx(auVar31,auVar33);
                auVar33 = vpunpcklbw_avx(auVar36,auVar37);
                auVar36 = vpunpckhbw_avx(auVar36,auVar37);
                auVar7 = vpmullw_avx(auVar13,auVar12);
                auVar2 = vpmulhw_avx(auVar12,auVar13);
                auVar8 = vpmullw_avx(auVar31,auVar12);
                auVar3 = vpmulhw_avx(auVar12,auVar31);
                auVar9 = vpmullw_avx(auVar33,auVar12);
                auVar4 = vpmulhw_avx(auVar12,auVar33);
                auVar10 = vpmullw_avx(auVar36,auVar12);
                auVar12 = vpmulhw_avx(auVar12,auVar36);
                local_58 = vpmullw_avx(auVar13,auVar11);
                auVar13 = vpmulhw_avx(auVar11,auVar13);
                local_68 = vpmullw_avx(auVar31,auVar11);
                auVar5 = vpmulhw_avx(auVar11,auVar31);
                local_78 = vpmullw_avx(auVar33,auVar11);
                auVar6 = vpmulhw_avx(auVar11,auVar33);
                local_88 = vpmullw_avx(auVar36,auVar11);
                auVar11 = vpmulhw_avx(auVar11,auVar36);
                auVar31 = vpunpcklwd_avx(auVar7,auVar2);
                auVar31 = vpaddd_avx(auVar38._0_16_,auVar31);
                auVar36 = vpunpcklwd_avx(auVar8,auVar3);
                auVar36 = vpaddd_avx(auVar36,local_128);
                auVar33 = vpunpcklwd_avx(auVar9,auVar4);
                auVar33 = vpaddd_avx(auVar33,local_118);
                auVar37 = vpunpcklwd_avx(auVar10,auVar12);
                auVar37 = vpaddd_avx(auVar37,local_a8);
                auVar2 = vpunpckhwd_avx(auVar7,auVar2);
                auVar31 = vpaddd_avx(auVar31,auVar2);
                auVar38 = ZEXT1664(auVar31);
                auVar2 = vpunpckhwd_avx(auVar8,auVar3);
                local_128 = vpaddd_avx(auVar36,auVar2);
                auVar36 = vpunpckhwd_avx(auVar9,auVar4);
                local_118 = vpaddd_avx(auVar33,auVar36);
                auVar36 = vpunpckhwd_avx(auVar10,auVar12);
                auVar36 = vpaddd_avx(auVar37,auVar36);
                auVar33 = vpunpcklwd_avx(local_58,auVar13);
                auVar33 = vpaddd_avx(auVar33,local_48);
                auVar37 = vpunpcklwd_avx(local_68,auVar5);
                auVar37 = vpaddd_avx(auVar37,local_138);
                auVar2 = vpunpcklwd_avx(local_78,auVar6);
                auVar2 = vpaddd_avx(auVar2,local_108);
                auVar3 = vpunpcklwd_avx(local_88,auVar11);
                auVar3 = vpaddd_avx(auVar3,local_98);
                auVar4 = vpunpckhwd_avx(local_58,auVar13);
                auVar33 = vpaddd_avx(auVar33,auVar4);
                auVar4 = vpunpckhwd_avx(local_68,auVar5);
                local_138 = vpaddd_avx(auVar37,auVar4);
                auVar37 = vpunpckhwd_avx(local_78,auVar6);
                local_108 = vpaddd_avx(auVar2,auVar37);
                auVar37 = vpunpckhwd_avx(local_88,auVar11);
                auVar37 = vpaddd_avx(auVar3,auVar37);
                lVar30 = lVar30 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            auVar3 = vpunpckldq_avx(auVar31,local_128);
            auVar4 = vpunpckldq_avx(local_118,auVar36);
            auVar2 = vpunpckhdq_avx(auVar31,local_128);
            auVar36 = vpunpckhdq_avx(local_118,auVar36);
            auVar12 = vpunpckldq_avx(auVar33,local_138);
            auVar13 = vpunpckldq_avx(local_108,auVar37);
            auVar33 = vpunpckhdq_avx(auVar33,local_138);
            auVar37 = vpunpckhdq_avx(local_108,auVar37);
            auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
            auVar31 = vpunpckhqdq_avx(auVar3,auVar4);
            auVar31 = vpaddd_avx(auVar5,auVar31);
            auVar3 = vpunpcklqdq_avx(auVar2,auVar36);
            auVar36 = vpunpckhqdq_avx(auVar2,auVar36);
            auVar36 = vpaddd_avx(auVar36,auVar3);
            auVar31 = vpaddd_avx(auVar31,auVar36);
            auVar2 = vpunpcklqdq_avx(auVar12,auVar13);
            auVar36 = vpunpckhqdq_avx(auVar12,auVar13);
            auVar36 = vpaddd_avx(auVar2,auVar36);
            auVar2 = vpunpcklqdq_avx(auVar33,auVar37);
            auVar33 = vpunpckhqdq_avx(auVar33,auVar37);
            auVar33 = vpaddd_avx(auVar33,auVar2);
            auVar36 = vpaddd_avx(auVar36,auVar33);
            *pauVar23 = auVar31;
            pauVar23[1] = auVar36;
            pauVar23 = pauVar23 + 2;
            uVar25 = uVar20 + 2;
            lVar26 = uVar20 + 3;
            lVar17 = lVar17 + 1;
            uVar20 = uVar25;
          } while (lVar26 < (long)uVar16);
        }
        if ((int)uVar25 < (int)uVar1) {
          do {
            if (iVar15 < 1) {
              auVar31 = (undefined1  [16])0x0;
              auVar36 = (undefined1  [16])0x0;
              auVar33 = (undefined1  [16])0x0;
              auVar37 = (undefined1  [16])0x0;
            }
            else {
              pauVar27 = (undefined1 (*) [16])
                         (kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data);
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              lVar17 = 0;
              auVar34 = ZEXT1664((undefined1  [16])0x0);
              auVar35 = ZEXT1664((undefined1  [16])0x0);
              auVar32 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar31._8_8_ = 0;
                auVar31._0_8_ =
                     *(ulong *)(local_f8._0_8_ +
                               lVar17 * 8 +
                               local_b8 * local_f8._16_8_ *
                               (ulong)(((uint)uVar25 & 1) + ((uint)(uVar25 >> 1) & 0x7fffffff)));
                auVar2 = vpmovsxbw_avx(auVar31);
                auVar31 = *pauVar27;
                auVar36 = pauVar27[1];
                auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
                auVar37 = vpcmpgtb_avx((undefined1  [16])0x0,auVar36);
                auVar3 = vpunpcklbw_avx(auVar31,auVar33);
                auVar31 = vpunpckhbw_avx(auVar31,auVar33);
                auVar33 = vpunpcklbw_avx(auVar36,auVar37);
                auVar36 = vpunpckhbw_avx(auVar36,auVar37);
                auVar13 = vpmullw_avx(auVar3,auVar2);
                auVar3 = vpmulhw_avx(auVar3,auVar2);
                auVar5 = vpmullw_avx(auVar31,auVar2);
                auVar4 = vpmulhw_avx(auVar2,auVar31);
                auVar6 = vpmullw_avx(auVar33,auVar2);
                auVar12 = vpmulhw_avx(auVar2,auVar33);
                auVar11 = vpmullw_avx(auVar36,auVar2);
                auVar2 = vpmulhw_avx(auVar2,auVar36);
                auVar31 = vpunpcklwd_avx(auVar13,auVar3);
                auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
                auVar36 = vpunpcklwd_avx(auVar5,auVar4);
                auVar36 = vpaddd_avx(auVar35._0_16_,auVar36);
                auVar33 = vpunpcklwd_avx(auVar6,auVar12);
                auVar33 = vpaddd_avx(auVar34._0_16_,auVar33);
                auVar37 = vpunpcklwd_avx(auVar11,auVar2);
                auVar37 = vpaddd_avx(auVar38._0_16_,auVar37);
                auVar3 = vpunpckhwd_avx(auVar13,auVar3);
                auVar31 = vpaddd_avx(auVar31,auVar3);
                auVar32 = ZEXT1664(auVar31);
                auVar3 = vpunpckhwd_avx(auVar5,auVar4);
                auVar36 = vpaddd_avx(auVar36,auVar3);
                auVar35 = ZEXT1664(auVar36);
                auVar3 = vpunpckhwd_avx(auVar6,auVar12);
                auVar33 = vpaddd_avx(auVar33,auVar3);
                auVar34 = ZEXT1664(auVar33);
                auVar2 = vpunpckhwd_avx(auVar11,auVar2);
                auVar37 = vpaddd_avx(auVar37,auVar2);
                auVar38 = ZEXT1664(auVar37);
                pauVar27 = pauVar27 + 2;
                lVar17 = lVar17 + 1;
              } while (iVar15 != (int)lVar17);
            }
            auVar2 = vpunpckldq_avx(auVar31,auVar36);
            auVar3 = vpunpckldq_avx(auVar33,auVar37);
            auVar36 = vpunpckhdq_avx(auVar31,auVar36);
            auVar33 = vpunpckhdq_avx(auVar33,auVar37);
            auVar37 = vpunpcklqdq_avx(auVar2,auVar3);
            auVar31 = vpunpckhqdq_avx(auVar2,auVar3);
            auVar31 = vpaddd_avx(auVar37,auVar31);
            auVar37 = vpunpcklqdq_avx(auVar36,auVar33);
            auVar36 = vpunpckhqdq_avx(auVar36,auVar33);
            auVar36 = vpaddd_avx(auVar36,auVar37);
            auVar31 = vpaddd_avx(auVar31,auVar36);
            *pauVar23 = auVar31;
            pauVar23 = pauVar23 + 1;
            uVar22 = (uint)uVar25 + 1;
            uVar25 = (ulong)uVar22;
          } while (uVar22 != uVar1);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_b0);
    }
    piVar14 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_f8._0_8_ != (void *)0x0) {
            free((void *)local_f8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_f8._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}